

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O0

void __thiscall embree::StdStream::StdStream(StdStream *this,istream *cin,string *name)

{
  string *this_00;
  string *in_RDX;
  element_type *in_RSI;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  Stream<int> *in_stack_ffffffffffffffe0;
  
  Stream<int>::Stream(in_stack_ffffffffffffffe0);
  (in_RDI->
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)&PTR__StdStream_00606c88;
  in_RDI[4].
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RSI;
  in_RDI[4].
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
  in_RDI[5].
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  in_RDI[5].
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (string *)::operator_new(0x20);
  std::__cxx11::string::string(this_00,in_RDX);
  std::shared_ptr<std::__cxx11::string>::shared_ptr<std::__cxx11::string,void>
            (in_RDI,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

StdStream (std::istream& cin, const std::string& name = "std::stream")
      : cin(cin), lineNumber(1), colNumber(0), charNumber(0), name(std::shared_ptr<std::string>(new std::string(name))) {}